

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O3

TestRole __thiscall testing::internal::NoExecDeathTest::AssumeRole(NoExecDeathTest *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  __pid_t _Var4;
  size_t sVar5;
  int *piVar6;
  long *plVar7;
  UnitTest *pUVar8;
  int (*paiVar9) [2];
  long *plVar10;
  size_type *psVar11;
  int aiVar12 [2];
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  long lVar14;
  TestRole TVar15;
  char *pcVar16;
  ostream *poVar17;
  string local_140;
  int local_11c;
  string local_118;
  int local_f8;
  int local_f4;
  int pipe_fd [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  sVar5 = GetThreadCount();
  if (sVar5 != 1) {
    GTestLog::GTestLog((GTestLog *)&local_90,GTEST_WARNING,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/vendor/googletest/googletest/src/gtest-death-test.cc"
                       ,0x450);
    Message::Message((Message *)&local_50);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_50._M_head_impl + 0x10),
               "Death tests use fork(), which is unsafe particularly",0x34);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_50._M_head_impl + 0x10)," in a threaded context. For this test, ",
               0x27);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_50._M_head_impl + 0x10),"Google Test",0xb);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_50._M_head_impl + 0x10)," ",1);
    poVar17 = (ostream *)(local_50._M_head_impl + 0x10);
    if (sVar5 == 0) {
      lVar14 = 0x26;
      pcVar16 = "couldn\'t detect the number of threads.";
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>(poVar17,"detected ",9);
      std::ostream::_M_insert<unsigned_long>((ulong)(local_50._M_head_impl + 0x10));
      poVar17 = (ostream *)(local_50._M_head_impl + 0x10);
      lVar14 = 9;
      pcVar16 = " threads.";
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,pcVar16,lVar14);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_50._M_head_impl + 0x10),
               " See https://github.com/google/googletest/blob/main/docs/advanced.md#death-tests-and-threads"
               ,0x5c);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_50._M_head_impl + 0x10),
               " for more explanation and suggested solutions, especially if",0x3c);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_50._M_head_impl + 0x10),
               " this is the last message you see before your test times out.",0x3d);
    Message::GetString_abi_cxx11_(&local_70,(Message *)&local_50);
    if (local_50._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_50._M_head_impl + 8))();
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,local_70._M_dataplus._M_p,local_70._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    GTestLog::~GTestLog((GTestLog *)&local_90);
  }
  do {
    iVar3 = pipe(&local_f8);
    bVar2 = IsTrue(iVar3 != -1);
    if (!bVar2) {
      local_d0 = &local_c0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"CHECK failed: File ","");
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_d0);
      local_b0._M_dataplus._M_p = (pointer)*plVar7;
      psVar11 = (size_type *)(plVar7 + 2);
      if ((size_type *)local_b0._M_dataplus._M_p == psVar11) {
        local_b0.field_2._M_allocated_capacity = *psVar11;
        local_b0.field_2._8_8_ = plVar7[3];
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      }
      else {
        local_b0.field_2._M_allocated_capacity = *psVar11;
      }
      local_b0._M_string_length = plVar7[1];
      *plVar7 = (long)psVar11;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      paiVar9 = (int (*) [2])std::__cxx11::string::append((char *)&local_b0);
      pipe_fd = *paiVar9;
      aiVar12 = (int  [2])(paiVar9 + 2);
      if (pipe_fd == aiVar12) {
        local_e0._M_allocated_capacity = *(undefined8 *)aiVar12;
        local_e0._8_8_ = paiVar9[3];
        pipe_fd = (int  [2])&local_e0;
      }
      else {
        local_e0._M_allocated_capacity = *(undefined8 *)aiVar12;
      }
      *paiVar9 = aiVar12;
      paiVar9[1] = (int  [2])0x0;
      *(undefined1 *)paiVar9[2] = 0;
      local_140._M_dataplus._M_p._0_4_ = 0x454;
      StreamableToString<int>(&local_118,(int *)&local_140);
      std::operator+(&local_90,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pipe_fd,
                     &local_118);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_90);
      local_50._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar7;
      pbVar13 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (plVar7 + 2);
      if (local_50._M_head_impl == pbVar13) {
        local_40 = *(long *)pbVar13;
        lStack_38 = plVar7[3];
        local_50._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_40;
      }
      else {
        local_40 = *(long *)pbVar13;
      }
      local_48 = plVar7[1];
      *plVar7 = (long)pbVar13;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_70._M_dataplus._M_p = (pointer)*plVar7;
      psVar11 = (size_type *)(plVar7 + 2);
      if ((size_type *)local_70._M_dataplus._M_p == psVar11) {
        local_70.field_2._M_allocated_capacity = *psVar11;
        local_70.field_2._8_8_ = plVar7[3];
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      }
      else {
        local_70.field_2._M_allocated_capacity = *psVar11;
      }
      local_70._M_string_length = plVar7[1];
      *plVar7 = (long)psVar11;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      DeathTestAbort(&local_70);
    }
    bVar2 = AlwaysTrue();
  } while (!bVar2);
  paVar1 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  std::__cxx11::string::_M_assign((string *)&DeathTest::last_death_test_message__abi_cxx11_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  CaptureStderr();
  fflush((FILE *)0x0);
  _Var4 = fork();
  do {
    bVar2 = IsTrue(_Var4 != -1);
    if (!bVar2) {
      local_d0 = &local_c0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"CHECK failed: File ","");
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_d0);
      local_b0._M_dataplus._M_p = (pointer)*plVar7;
      psVar11 = (size_type *)(plVar7 + 2);
      if ((size_type *)local_b0._M_dataplus._M_p == psVar11) {
        local_b0.field_2._M_allocated_capacity = *psVar11;
        local_b0.field_2._8_8_ = plVar7[3];
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      }
      else {
        local_b0.field_2._M_allocated_capacity = *psVar11;
      }
      local_b0._M_string_length = plVar7[1];
      *plVar7 = (long)psVar11;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      paiVar9 = (int (*) [2])std::__cxx11::string::append((char *)&local_b0);
      pipe_fd = *paiVar9;
      aiVar12 = (int  [2])(paiVar9 + 2);
      if (pipe_fd == aiVar12) {
        local_e0._M_allocated_capacity = *(undefined8 *)aiVar12;
        local_e0._8_8_ = paiVar9[3];
        pipe_fd = (int  [2])&local_e0;
      }
      else {
        local_e0._M_allocated_capacity = *(undefined8 *)aiVar12;
      }
      *paiVar9 = aiVar12;
      paiVar9[1] = (int  [2])0x0;
      *(undefined1 *)paiVar9[2] = 0;
      local_140._M_dataplus._M_p._0_4_ = 0x462;
      StreamableToString<int>(&local_118,(int *)&local_140);
      std::operator+(&local_90,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pipe_fd,
                     &local_118);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_90);
      local_50._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar7;
      pbVar13 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (plVar7 + 2);
      if (local_50._M_head_impl == pbVar13) {
        local_40 = *(long *)pbVar13;
        lStack_38 = plVar7[3];
        local_50._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_40;
      }
      else {
        local_40 = *(long *)pbVar13;
      }
      local_48 = plVar7[1];
      *plVar7 = (long)pbVar13;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_70._M_dataplus._M_p = (pointer)*plVar7;
      psVar11 = (size_type *)(plVar7 + 2);
      if ((size_type *)local_70._M_dataplus._M_p == psVar11) {
        local_70.field_2._M_allocated_capacity = *psVar11;
        local_70.field_2._8_8_ = plVar7[3];
        local_70._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_70.field_2._M_allocated_capacity = *psVar11;
      }
      local_70._M_string_length = plVar7[1];
      *plVar7 = (long)psVar11;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      DeathTestAbort(&local_70);
    }
    bVar2 = AlwaysTrue();
  } while (!bVar2);
  *(__pid_t *)&(this->super_ForkingDeathTest).super_DeathTestImpl.field_0x3c = _Var4;
  if (_Var4 == 0) {
    do {
      while( true ) {
        iVar3 = close(local_f8);
        if (iVar3 != -1) break;
        piVar6 = __errno_location();
        if (*piVar6 != 4) {
          local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_118,"CHECK failed: File ","");
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_118);
          local_d0 = (long *)*plVar7;
          plVar10 = plVar7 + 2;
          if (local_d0 == plVar10) {
            local_c0 = *plVar10;
            lStack_b8 = plVar7[3];
            local_d0 = &local_c0;
          }
          else {
            local_c0 = *plVar10;
          }
          local_c8 = plVar7[1];
          *plVar7 = (long)plVar10;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_d0);
          local_b0._M_dataplus._M_p = (pointer)*plVar7;
          psVar11 = (size_type *)(plVar7 + 2);
          if ((size_type *)local_b0._M_dataplus._M_p == psVar11) {
            local_b0.field_2._M_allocated_capacity = *psVar11;
            local_b0.field_2._8_8_ = plVar7[3];
            local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          }
          else {
            local_b0.field_2._M_allocated_capacity = *psVar11;
          }
          local_b0._M_string_length = plVar7[1];
          *plVar7 = (long)psVar11;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          local_11c = 0x465;
          StreamableToString<int>(&local_140,&local_11c);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         pipe_fd,&local_b0,&local_140);
          plVar7 = (long *)std::__cxx11::string::append((char *)pipe_fd);
          local_90._M_dataplus._M_p = (pointer)*plVar7;
          psVar11 = (size_type *)(plVar7 + 2);
          if ((size_type *)local_90._M_dataplus._M_p == psVar11) {
            local_90.field_2._M_allocated_capacity = *psVar11;
            local_90.field_2._8_8_ = plVar7[3];
            local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          }
          else {
            local_90.field_2._M_allocated_capacity = *psVar11;
          }
          local_90._M_string_length = plVar7[1];
          *plVar7 = (long)psVar11;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_90);
          local_50._M_head_impl =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar7;
          pbVar13 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (plVar7 + 2);
          if (local_50._M_head_impl == pbVar13) {
            local_40 = *(long *)pbVar13;
            lStack_38 = plVar7[3];
            local_50._M_head_impl =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &local_40;
          }
          else {
            local_40 = *(long *)pbVar13;
          }
          local_48 = plVar7[1];
          *plVar7 = (long)pbVar13;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_50);
          local_70._M_dataplus._M_p = (pointer)*plVar7;
          psVar11 = (size_type *)(plVar7 + 2);
          if ((size_type *)local_70._M_dataplus._M_p == psVar11) {
            local_70.field_2._M_allocated_capacity = *psVar11;
            local_70.field_2._8_8_ = plVar7[3];
            local_70._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_70.field_2._M_allocated_capacity = *psVar11;
          }
          local_70._M_string_length = plVar7[1];
          *plVar7 = (long)psVar11;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          DeathTestAbort(&local_70);
        }
      }
      bVar2 = AlwaysTrue();
    } while (!bVar2);
    (this->super_ForkingDeathTest).super_DeathTestImpl.write_fd_ = local_f4;
    pUVar8 = UnitTest::GetInstance();
    TVar15 = EXECUTE_TEST;
    TestEventListeners::SuppressEventForwarding(&pUVar8->impl_->listeners_,true);
    g_in_fast_death_test_child = 1;
  }
  else {
    do {
      while( true ) {
        iVar3 = close(local_f4);
        if (iVar3 != -1) break;
        piVar6 = __errno_location();
        if (*piVar6 != 4) {
          local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_118,"CHECK failed: File ","");
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_118);
          local_d0 = (long *)*plVar7;
          plVar10 = plVar7 + 2;
          if (local_d0 == plVar10) {
            local_c0 = *plVar10;
            lStack_b8 = plVar7[3];
            local_d0 = &local_c0;
          }
          else {
            local_c0 = *plVar10;
          }
          local_c8 = plVar7[1];
          *plVar7 = (long)plVar10;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_d0);
          local_b0._M_dataplus._M_p = (pointer)*plVar7;
          psVar11 = (size_type *)(plVar7 + 2);
          if ((size_type *)local_b0._M_dataplus._M_p == psVar11) {
            local_b0.field_2._M_allocated_capacity = *psVar11;
            local_b0.field_2._8_8_ = plVar7[3];
            local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          }
          else {
            local_b0.field_2._M_allocated_capacity = *psVar11;
          }
          local_b0._M_string_length = plVar7[1];
          *plVar7 = (long)psVar11;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          local_11c = 0x471;
          StreamableToString<int>(&local_140,&local_11c);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         pipe_fd,&local_b0,&local_140);
          plVar7 = (long *)std::__cxx11::string::append((char *)pipe_fd);
          local_90._M_dataplus._M_p = (pointer)*plVar7;
          psVar11 = (size_type *)(plVar7 + 2);
          if ((size_type *)local_90._M_dataplus._M_p == psVar11) {
            local_90.field_2._M_allocated_capacity = *psVar11;
            local_90.field_2._8_8_ = plVar7[3];
            local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          }
          else {
            local_90.field_2._M_allocated_capacity = *psVar11;
          }
          local_90._M_string_length = plVar7[1];
          *plVar7 = (long)psVar11;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_90);
          local_50._M_head_impl =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar7;
          pbVar13 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (plVar7 + 2);
          if (local_50._M_head_impl == pbVar13) {
            local_40 = *(long *)pbVar13;
            lStack_38 = plVar7[3];
            local_50._M_head_impl =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &local_40;
          }
          else {
            local_40 = *(long *)pbVar13;
          }
          local_48 = plVar7[1];
          *plVar7 = (long)pbVar13;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_50);
          local_70._M_dataplus._M_p = (pointer)*plVar7;
          psVar11 = (size_type *)(plVar7 + 2);
          if ((size_type *)local_70._M_dataplus._M_p == psVar11) {
            local_70.field_2._M_allocated_capacity = *psVar11;
            local_70.field_2._8_8_ = plVar7[3];
            local_70._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_70.field_2._M_allocated_capacity = *psVar11;
          }
          local_70._M_string_length = plVar7[1];
          *plVar7 = (long)psVar11;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          DeathTestAbort(&local_70);
        }
      }
      bVar2 = AlwaysTrue();
    } while (!bVar2);
    (this->super_ForkingDeathTest).super_DeathTestImpl.read_fd_ = local_f8;
    (this->super_ForkingDeathTest).super_DeathTestImpl.spawned_ = true;
    TVar15 = OVERSEE_TEST;
  }
  return TVar15;
}

Assistant:

DeathTest::TestRole NoExecDeathTest::AssumeRole() {
  const size_t thread_count = GetThreadCount();
  if (thread_count != 1) {
    GTEST_LOG_(WARNING) << DeathTestThreadWarning(thread_count);
  }

  int pipe_fd[2];
  GTEST_DEATH_TEST_CHECK_(pipe(pipe_fd) != -1);

  DeathTest::set_last_death_test_message("");
  CaptureStderr();
  // When we fork the process below, the log file buffers are copied, but the
  // file descriptors are shared.  We flush all log files here so that closing
  // the file descriptors in the child process doesn't throw off the
  // synchronization between descriptors and buffers in the parent process.
  // This is as close to the fork as possible to avoid a race condition in case
  // there are multiple threads running before the death test, and another
  // thread writes to the log file.
  FlushInfoLog();

  const pid_t child_pid = fork();
  GTEST_DEATH_TEST_CHECK_(child_pid != -1);
  set_child_pid(child_pid);
  if (child_pid == 0) {
    GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[0]));
    set_write_fd(pipe_fd[1]);
    // Redirects all logging to stderr in the child process to prevent
    // concurrent writes to the log files.  We capture stderr in the parent
    // process and append the child process' output to a log.
    LogToStderr();
    // Event forwarding to the listeners of event listener API mush be shut
    // down in death test subprocesses.
    GetUnitTestImpl()->listeners()->SuppressEventForwarding(true);
    g_in_fast_death_test_child = true;
    return EXECUTE_TEST;
  } else {
    GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[1]));
    set_read_fd(pipe_fd[0]);
    set_spawned(true);
    return OVERSEE_TEST;
  }
}